

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

void __thiscall
QDockWidgetGroupLayout::QDockWidgetGroupLayout
          (QDockWidgetGroupLayout *this,QDockWidgetGroupWindow *parent)

{
  QWidgetResizeHandler *this_00;
  
  QLayout::QLayout(&this->super_QLayout,&parent->super_QWidget);
  QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>::QMainWindowLayoutSeparatorHelper
            (&this->super_QMainWindowLayoutSeparatorHelper<QDockWidgetGroupLayout>);
  *(undefined ***)&this->super_QLayout = &PTR_metaObject_007cf580;
  (this->super_QLayout).super_QLayoutItem._vptr_QLayoutItem =
       (_func_int **)&PTR__QDockWidgetGroupLayout_007cf688;
  QDockAreaLayoutInfo::QDockAreaLayoutInfo(&this->layoutState);
  QDockAreaLayoutInfo::QDockAreaLayoutInfo(&this->savedState);
  QLayout::setSizeConstraint(&this->super_QLayout,SetMinAndMaxSize);
  this_00 = (QWidgetResizeHandler *)operator_new(0x48);
  QWidgetResizeHandler::QWidgetResizeHandler
            ((QWidgetResizeHandler *)this_00,&parent->super_QWidget,(QWidget *)0x0);
  this->resizer = this_00;
  return;
}

Assistant:

QDockWidgetGroupLayout(QDockWidgetGroupWindow* parent) : QLayout(parent) {
        setSizeConstraint(QLayout::SetMinAndMaxSize);
        resizer = new QWidgetResizeHandler(parent);
    }